

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O0

void __thiscall
gl3cts::TextureSwizzle::FunctionalTest::prepareProgram
          (FunctionalTest *this,size_t format_idx,programInfo *program)

{
  _texture_format *this_00;
  GLchar *pGVar1;
  GLchar *vertex_shader_code;
  size_t local_f8;
  size_t position;
  undefined1 local_e8 [8];
  string fs;
  testCase local_b8;
  string local_78;
  string *local_58;
  string *vs;
  string *local_30;
  string *values;
  _texture_format *format;
  programInfo *program_local;
  size_t format_idx_local;
  FunctionalTest *this_local;
  
  values = (string *)(texture_formats + format_idx * 0x78);
  format = (_texture_format *)program;
  program_local = (programInfo *)format_idx;
  format_idx_local = (size_t)this;
  prepareValues_abi_cxx11_((string *)&vs,this,format_idx);
  local_b8.m_texture_sizes[0] = 0;
  local_b8.m_texture_sizes[1] = 0;
  local_b8.m_texture_sizes[2] = 0;
  local_b8.m_texture_sizes[3] = 0;
  local_b8.m_texture_swizzle_red = 0;
  local_b8.m_texture_swizzle_green = 0;
  local_b8.m_texture_swizzle_blue = 0;
  local_b8.m_texture_swizzle_alpha = 0;
  local_b8.m_source_texture_target_index = 0;
  local_b8.m_texture_access_index = 0;
  local_b8.m_channel_index = 0;
  local_b8.m_source_texture_format_index = 0;
  local_30 = (string *)&vs;
  SmokeTest::getVertexShader_abi_cxx11_(&local_78,&this->super_SmokeTest,&local_b8,false);
  pGVar1 = prepareProgram::fs_template;
  local_58 = &local_78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_e8,pGVar1,(allocator<char> *)((long)&position + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&position + 7));
  local_f8 = 0;
  Utils::replaceToken("PREFIX",&local_f8,*(GLchar **)(*(long *)((long)&values->field_2 + 8) + 8),
                      (string *)local_e8);
  Utils::replaceToken("PREFIX",&local_f8,*(GLchar **)(*(long *)((long)&values->field_2 + 8) + 8),
                      (string *)local_e8);
  pGVar1 = (GLchar *)std::__cxx11::string::c_str();
  Utils::replaceToken("VALUES",&local_f8,pGVar1,(string *)local_e8);
  this_00 = format;
  pGVar1 = (GLchar *)std::__cxx11::string::c_str();
  vertex_shader_code = (GLchar *)std::__cxx11::string::c_str();
  Utils::programInfo::build((programInfo *)this_00,pGVar1,vertex_shader_code);
  std::__cxx11::string::~string((string *)local_e8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&vs);
  return;
}

Assistant:

void FunctionalTest::prepareProgram(size_t format_idx, Utils::programInfo& program)
{
	static const glw::GLchar* fs_template = "#version 330 core\n"
											"\n"
											"out PREFIXvec4 out_color;\n"
											"\n"
											"void main()\n"
											"{\n"
											"    out_color = PREFIXvec4(VALUES);\n"
											"}\n"
											"\n";

	const _texture_format& format = texture_formats[format_idx];
	const std::string&	 values = prepareValues(format_idx);
	const std::string&	 vs	 = getVertexShader(testCase(), false); /* Get blank VS */

	std::string fs		 = fs_template;
	size_t		position = 0;

	Utils::replaceToken("PREFIX", position, format.m_sampler.m_sampler_prefix, fs);
	Utils::replaceToken("PREFIX", position, format.m_sampler.m_sampler_prefix, fs);
	Utils::replaceToken("VALUES", position, values.c_str(), fs);

	program.build(fs.c_str(), vs.c_str());
}